

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_true,_embree::avx::SubdivPatch1IntersectorK<4>,_true>::
     occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray,
              TravRayK<4,_true> *tray,RayQueryContext *context)

{
  undefined4 uVar1;
  float fVar2;
  int iVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  uint uVar7;
  RTCFilterFunctionN p_Var8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  byte bVar34;
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  ulong uVar65;
  uint uVar66;
  long lVar67;
  ulong uVar68;
  GridSOA *pGVar69;
  ulong uVar70;
  char *pcVar71;
  Geometry *pGVar72;
  ulong *puVar73;
  ulong uVar74;
  ulong uVar75;
  ulong uVar76;
  bool bVar77;
  float fVar78;
  float fVar85;
  float fVar86;
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  undefined1 auVar83 [32];
  float fVar87;
  undefined1 auVar84 [32];
  float fVar94;
  float fVar96;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  float fVar95;
  float fVar97;
  float fVar98;
  float fVar99;
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  undefined1 auVar93 [32];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [16];
  undefined1 auVar109 [32];
  float fVar111;
  undefined1 auVar110 [64];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar115;
  float fVar116;
  undefined1 auVar114 [64];
  float fVar117;
  float fVar118;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  float fVar132;
  float fVar133;
  undefined1 auVar121 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [16];
  undefined1 auVar137 [32];
  float fVar141;
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  float fVar147;
  float fVar148;
  float fVar151;
  float fVar152;
  undefined1 auVar149 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  undefined1 auVar150 [32];
  float fVar157;
  float fVar158;
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar161 [32];
  float fVar165;
  undefined1 auVar163 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [32];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  float fVar183;
  undefined1 auVar176 [16];
  float fVar184;
  float fVar185;
  float fVar186;
  float fVar187;
  float fVar188;
  float fVar189;
  float fVar190;
  float fVar191;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar177 [32];
  undefined1 auVar196 [16];
  float fVar197;
  float fVar199;
  float fVar200;
  undefined1 auVar198 [16];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  float fVar214;
  float fVar215;
  float fVar216;
  float fVar217;
  float fVar218;
  float old_t;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  char *local_c78;
  ulong local_c70;
  ulong local_c68;
  undefined1 local_c60 [32];
  undefined1 local_c40 [32];
  undefined1 local_c20 [32];
  undefined1 local_bf0 [16];
  undefined1 (*local_be0) [16];
  ulong local_bd8;
  undefined1 local_bd0 [16];
  undefined1 local_bc0 [16];
  RTCFilterFunctionNArguments local_bb0;
  Geometry *local_b80;
  undefined1 auStack_b78 [24];
  undefined1 local_b60 [16];
  undefined1 auStack_b50 [16];
  undefined1 local_b40 [16];
  undefined1 auStack_b30 [16];
  undefined4 local_b20;
  undefined4 uStack_b1c;
  undefined4 uStack_b18;
  undefined4 uStack_b14;
  float fStack_b10;
  float fStack_b0c;
  float fStack_b08;
  float fStack_b04;
  undefined1 local_b00 [32];
  undefined4 local_ad0;
  undefined4 uStack_acc;
  undefined4 uStack_ac8;
  undefined4 uStack_ac4;
  undefined4 local_ac0;
  undefined4 uStack_abc;
  undefined4 uStack_ab8;
  undefined4 uStack_ab4;
  undefined4 local_ab0;
  undefined4 uStack_aac;
  undefined4 uStack_aa8;
  undefined4 uStack_aa4;
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  undefined1 local_a90 [16];
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined1 local_a70 [16];
  uint local_a60;
  uint uStack_a5c;
  uint uStack_a58;
  uint uStack_a54;
  uint uStack_a50;
  uint uStack_a4c;
  uint uStack_a48;
  uint uStack_a44;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  float local_940;
  float fStack_93c;
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  char **local_900;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  float local_8a0 [4];
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  size_t local_800;
  ulong local_7f8 [249];
  undefined1 auVar119 [16];
  undefined1 auVar120 [24];
  undefined1 auVar122 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [24];
  undefined1 auVar162 [32];
  
  puVar73 = local_7f8;
  local_800 = root.ptr;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar176._4_4_ = uVar1;
  auVar176._0_4_ = uVar1;
  auVar176._8_4_ = uVar1;
  auVar176._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar196._4_4_ = uVar1;
  auVar196._0_4_ = uVar1;
  auVar196._8_4_ = uVar1;
  auVar196._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar198._4_4_ = uVar1;
  auVar198._0_4_ = uVar1;
  auVar198._8_4_ = uVar1;
  auVar198._12_4_ = uVar1;
  fVar78 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar85 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar112 = ZEXT416((uint)(fVar78 * 0.99999964));
  auVar112 = vshufps_avx(auVar112,auVar112,0);
  auVar108 = ZEXT416((uint)(fVar85 * 0.99999964));
  local_bc0 = vshufps_avx(auVar108,auVar108,0);
  auVar114 = ZEXT1664(local_bc0);
  auVar108 = ZEXT416((uint)(fVar2 * 0.99999964));
  auVar108 = vshufps_avx(auVar108,auVar108,0);
  auVar79 = ZEXT416((uint)(fVar78 * 1.0000004));
  auVar79 = vshufps_avx(auVar79,auVar79,0);
  auVar80 = ZEXT416((uint)(fVar85 * 1.0000004));
  auVar80 = vshufps_avx(auVar80,auVar80,0);
  auVar81 = ZEXT416((uint)(fVar2 * 1.0000004));
  local_bd0 = vshufps_avx(auVar81,auVar81,0);
  auVar110 = ZEXT1664(local_bd0);
  local_bd8 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar75 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar74 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  uVar76 = local_bd8 ^ 0x10;
  iVar3 = (tray->tnear).field_0.i[k];
  auVar81._4_4_ = iVar3;
  auVar81._0_4_ = iVar3;
  auVar81._8_4_ = iVar3;
  auVar81._12_4_ = iVar3;
  iVar3 = (tray->tfar).field_0.i[k];
  auVar149._4_4_ = iVar3;
  auVar149._0_4_ = iVar3;
  auVar149._8_4_ = iVar3;
  auVar149._12_4_ = iVar3;
  local_be0 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar77 = true;
  do {
    uVar68 = puVar73[-1];
    puVar73 = puVar73 + -1;
    while ((uVar68 & 8) == 0) {
      auVar119 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + local_bd8),auVar176);
      auVar82._0_4_ = auVar112._0_4_ * auVar119._0_4_;
      auVar82._4_4_ = auVar112._4_4_ * auVar119._4_4_;
      auVar82._8_4_ = auVar112._8_4_ * auVar119._8_4_;
      auVar82._12_4_ = auVar112._12_4_ * auVar119._12_4_;
      auVar119 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar75),auVar196);
      auVar113._0_4_ = auVar114._0_4_ * auVar119._0_4_;
      auVar113._4_4_ = auVar114._4_4_ * auVar119._4_4_;
      auVar113._8_4_ = auVar114._8_4_ * auVar119._8_4_;
      auVar113._12_4_ = auVar114._12_4_ * auVar119._12_4_;
      auVar119 = vmaxps_avx(auVar82,auVar113);
      auVar82 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar74),auVar198);
      auVar91._0_4_ = auVar108._0_4_ * auVar82._0_4_;
      auVar91._4_4_ = auVar108._4_4_ * auVar82._4_4_;
      auVar91._8_4_ = auVar108._8_4_ * auVar82._8_4_;
      auVar91._12_4_ = auVar108._12_4_ * auVar82._12_4_;
      auVar82 = vmaxps_avx(auVar91,auVar81);
      auVar119 = vmaxps_avx(auVar119,auVar82);
      auVar82 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + uVar76),auVar176);
      auVar136._0_4_ = auVar79._0_4_ * auVar82._0_4_;
      auVar136._4_4_ = auVar79._4_4_ * auVar82._4_4_;
      auVar136._8_4_ = auVar79._8_4_ * auVar82._8_4_;
      auVar136._12_4_ = auVar79._12_4_ * auVar82._12_4_;
      auVar82 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar75 ^ 0x10)),auVar196);
      auVar104._0_4_ = auVar80._0_4_ * auVar82._0_4_;
      auVar104._4_4_ = auVar80._4_4_ * auVar82._4_4_;
      auVar104._8_4_ = auVar80._8_4_ * auVar82._8_4_;
      auVar104._12_4_ = auVar80._12_4_ * auVar82._12_4_;
      auVar82 = vminps_avx(auVar136,auVar104);
      auVar113 = vsubps_avx(*(undefined1 (*) [16])(uVar68 + 0x20 + (uVar74 ^ 0x10)),auVar198);
      auVar171._0_4_ = auVar110._0_4_ * auVar113._0_4_;
      auVar171._4_4_ = auVar110._4_4_ * auVar113._4_4_;
      auVar171._8_4_ = auVar110._8_4_ * auVar113._8_4_;
      auVar171._12_4_ = auVar110._12_4_ * auVar113._12_4_;
      auVar113 = vminps_avx(auVar171,auVar149);
      auVar82 = vminps_avx(auVar82,auVar113);
      auVar119 = vcmpps_avx(auVar119,auVar82,2);
      uVar66 = vmovmskps_avx(auVar119);
      if (uVar66 == 0) goto LAB_00349aaf;
      uVar66 = uVar66 & 0xff;
      uVar65 = uVar68 & 0xfffffffffffffff0;
      lVar67 = 0;
      if (uVar66 != 0) {
        for (; (uVar66 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
        }
      }
      uVar68 = *(ulong *)(uVar65 + lVar67 * 8);
      uVar66 = uVar66 - 1 & uVar66;
      if (uVar66 != 0) {
        *puVar73 = uVar68;
        puVar73 = puVar73 + 1;
        lVar67 = 0;
        if (uVar66 != 0) {
          for (; (uVar66 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
          }
        }
        uVar68 = *(ulong *)(uVar65 + lVar67 * 8);
        uVar66 = uVar66 - 1 & uVar66;
        uVar70 = (ulong)uVar66;
        if (uVar66 != 0) {
          do {
            *puVar73 = uVar68;
            puVar73 = puVar73 + 1;
            lVar67 = 0;
            if (uVar70 != 0) {
              for (; (uVar70 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
              }
            }
            uVar68 = *(ulong *)(uVar65 + lVar67 * 8);
            uVar70 = uVar70 & uVar70 - 1;
          } while (uVar70 != 0);
        }
      }
    }
    if (((uint)uVar68 & 0xf) == 8) {
      pGVar69 = (pre->super_Precalculations).grid;
      uVar66 = pGVar69->width;
      local_c70 = (ulong)uVar66;
      uVar6 = pGVar69->height;
      local_c68 = (ulong)uVar6;
      uVar7 = pGVar69->gridOffset;
      uVar68 = uVar68 >> 4;
      lVar67 = uVar68 * 4 + (ulong)uVar7;
      auVar119 = *(undefined1 (*) [16])(pGVar69->data + local_c70 * 4 + lVar67 + -4);
      auVar82 = auVar119;
      if (2 < local_c68) {
        auVar82 = *(undefined1 (*) [16])
                   (pGVar69->data + local_c70 * 8 + uVar68 * 4 + (ulong)uVar7 + -4);
      }
      auVar113 = *(undefined1 (*) [16])(pGVar69->data + uVar68 * 4 + (ulong)uVar7 + -4);
      if (local_c70 == 2) {
        auVar113 = vshufps_avx(auVar113,auVar113,0x54);
        auVar119 = vshufps_avx(auVar119,auVar119,0x54);
        auVar82 = vshufps_avx(auVar82,auVar82,0x54);
      }
      uVar68 = (ulong)pGVar69->dim_offset;
      pcVar71 = pGVar69->data + uVar68 * 4 + lVar67 + -4;
      auVar91 = *(undefined1 (*) [16])(pcVar71 + local_c70 * 4);
      auVar136 = auVar91;
      if (2 < uVar6) {
        auVar136 = *(undefined1 (*) [16])(pcVar71 + local_c70 * 8);
      }
      auVar104 = *(undefined1 (*) [16])pcVar71;
      if (uVar66 == 2) {
        auVar104 = vshufps_avx(auVar104,auVar104,0x54);
        auVar91 = vshufps_avx(auVar91,auVar91,0x54);
        auVar136 = vshufps_avx(auVar136,auVar136,0x54);
      }
      pcVar71 = pGVar69->data + uVar68 * 8 + lVar67 + -4;
      auVar171 = *(undefined1 (*) [16])(pcVar71 + local_c70 * 4);
      auVar159 = auVar171;
      if (2 < uVar6) {
        auVar159 = *(undefined1 (*) [16])(pcVar71 + local_c70 * 8);
      }
      auVar142._16_16_ = auVar119;
      auVar142._0_16_ = auVar113;
      auVar83._16_16_ = auVar82;
      auVar83._0_16_ = auVar119;
      auVar31 = vunpcklps_avx(auVar142,auVar83);
      auVar142 = vshufps_avx(auVar142,auVar142,0xa5);
      auVar83 = vshufps_avx(auVar83,auVar83,0x94);
      auVar137._16_16_ = auVar91;
      auVar137._0_16_ = auVar104;
      auVar143._16_16_ = auVar136;
      auVar143._0_16_ = auVar91;
      auVar32 = vunpcklps_avx(auVar137,auVar143);
      auVar137 = vshufps_avx(auVar137,auVar137,0xa5);
      auVar143 = vshufps_avx(auVar143,auVar143,0x94);
      auVar119 = *(undefined1 (*) [16])pcVar71;
      if (uVar66 == 2) {
        auVar119 = vshufps_avx(auVar119,auVar119,0x54);
        auVar171 = vshufps_avx(auVar171,auVar171,0x54);
        auVar159 = vshufps_avx(auVar159,auVar159,0x54);
      }
      local_c78 = pGVar69->data + uVar68 * 0xc + lVar67 + -4;
      auVar144._16_16_ = auVar171;
      auVar144._0_16_ = auVar119;
      auVar121._16_16_ = auVar159;
      auVar121._0_16_ = auVar171;
      auVar33 = vunpcklps_avx(auVar144,auVar121);
      auVar26 = vshufps_avx(auVar144,auVar144,0xa5);
      auVar27 = vshufps_avx(auVar121,auVar121,0x94);
      uVar1 = *(undefined4 *)(ray + k * 4);
      auVar161._4_4_ = uVar1;
      auVar161._0_4_ = uVar1;
      auVar161._8_4_ = uVar1;
      auVar161._12_4_ = uVar1;
      auVar161._16_4_ = uVar1;
      auVar161._20_4_ = uVar1;
      auVar161._24_4_ = uVar1;
      auVar161._28_4_ = uVar1;
      uVar4 = *(undefined4 *)(ray + k * 4 + 0x10);
      auVar172._4_4_ = uVar4;
      auVar172._0_4_ = uVar4;
      auVar172._8_4_ = uVar4;
      auVar172._12_4_ = uVar4;
      auVar172._16_4_ = uVar4;
      auVar172._20_4_ = uVar4;
      auVar172._24_4_ = uVar4;
      auVar172._28_4_ = uVar4;
      uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
      auVar177._4_4_ = uVar5;
      auVar177._0_4_ = uVar5;
      auVar177._8_4_ = uVar5;
      auVar177._12_4_ = uVar5;
      auVar177._16_4_ = uVar5;
      auVar177._20_4_ = uVar5;
      auVar177._24_4_ = uVar5;
      auVar177._28_4_ = uVar5;
      auVar31 = vsubps_avx(auVar31,auVar161);
      auVar32 = vsubps_avx(auVar32,auVar172);
      auVar33 = vsubps_avx(auVar33,auVar177);
      auVar142 = vsubps_avx(auVar142,auVar161);
      auVar137 = vsubps_avx(auVar137,auVar172);
      auVar26 = vsubps_avx(auVar26,auVar177);
      auVar83 = vsubps_avx(auVar83,auVar161);
      auVar143 = vsubps_avx(auVar143,auVar172);
      auVar27 = vsubps_avx(auVar27,auVar177);
      local_980 = vsubps_avx(auVar83,auVar31);
      local_9a0 = vsubps_avx(auVar143,auVar32);
      local_9c0 = vsubps_avx(auVar27,auVar33);
      fVar2 = auVar32._0_4_;
      fVar78 = auVar143._0_4_ + fVar2;
      fVar11 = auVar32._4_4_;
      fVar85 = auVar143._4_4_ + fVar11;
      fVar97 = auVar32._8_4_;
      fVar86 = auVar143._8_4_ + fVar97;
      fVar101 = auVar32._12_4_;
      fVar87 = auVar143._12_4_ + fVar101;
      fVar13 = auVar32._16_4_;
      fVar88 = auVar143._16_4_ + fVar13;
      fVar16 = auVar32._20_4_;
      fVar89 = auVar143._20_4_ + fVar16;
      fVar19 = auVar32._24_4_;
      fVar90 = auVar143._24_4_ + fVar19;
      fVar9 = auVar33._0_4_;
      fVar147 = auVar27._0_4_ + fVar9;
      fVar12 = auVar33._4_4_;
      fVar151 = auVar27._4_4_ + fVar12;
      fVar98 = auVar33._8_4_;
      fVar152 = auVar27._8_4_ + fVar98;
      fVar102 = auVar33._12_4_;
      fVar153 = auVar27._12_4_ + fVar102;
      fVar14 = auVar33._16_4_;
      fVar154 = auVar27._16_4_ + fVar14;
      fVar17 = auVar33._20_4_;
      fVar155 = auVar27._20_4_ + fVar17;
      fVar20 = auVar33._24_4_;
      fVar156 = auVar27._24_4_ + fVar20;
      fVar148 = auVar33._28_4_;
      fVar118 = auVar27._28_4_;
      fVar94 = local_9c0._0_4_;
      fVar96 = local_9c0._4_4_;
      auVar28._4_4_ = fVar85 * fVar96;
      auVar28._0_4_ = fVar78 * fVar94;
      fVar99 = local_9c0._8_4_;
      auVar28._8_4_ = fVar86 * fVar99;
      fVar22 = local_9c0._12_4_;
      auVar28._12_4_ = fVar87 * fVar22;
      fVar23 = local_9c0._16_4_;
      auVar28._16_4_ = fVar88 * fVar23;
      fVar24 = local_9c0._20_4_;
      auVar28._20_4_ = fVar89 * fVar24;
      fVar25 = local_9c0._24_4_;
      auVar28._24_4_ = fVar90 * fVar25;
      auVar28._28_4_ = uVar1;
      fVar205 = local_9a0._0_4_;
      fVar207 = local_9a0._4_4_;
      auVar29._4_4_ = fVar207 * fVar151;
      auVar29._0_4_ = fVar205 * fVar147;
      fVar209 = local_9a0._8_4_;
      auVar29._8_4_ = fVar209 * fVar152;
      fVar211 = local_9a0._12_4_;
      auVar29._12_4_ = fVar211 * fVar153;
      fVar213 = local_9a0._16_4_;
      auVar29._16_4_ = fVar213 * fVar154;
      fVar215 = local_9a0._20_4_;
      auVar29._20_4_ = fVar215 * fVar155;
      fVar217 = local_9a0._24_4_;
      auVar29._24_4_ = fVar217 * fVar156;
      auVar29._28_4_ = uVar4;
      auVar28 = vsubps_avx(auVar29,auVar28);
      fVar10 = auVar31._0_4_;
      fVar157 = auVar83._0_4_ + fVar10;
      fVar95 = auVar31._4_4_;
      fVar164 = auVar83._4_4_ + fVar95;
      fVar100 = auVar31._8_4_;
      fVar166 = auVar83._8_4_ + fVar100;
      fVar103 = auVar31._12_4_;
      fVar167 = auVar83._12_4_ + fVar103;
      fVar15 = auVar31._16_4_;
      fVar168 = auVar83._16_4_ + fVar15;
      fVar18 = auVar31._20_4_;
      fVar169 = auVar83._20_4_ + fVar18;
      fVar21 = auVar31._24_4_;
      fVar170 = auVar83._24_4_ + fVar21;
      fVar141 = auVar83._28_4_;
      fVar173 = local_980._0_4_;
      fVar178 = local_980._4_4_;
      auVar30._4_4_ = fVar178 * fVar151;
      auVar30._0_4_ = fVar173 * fVar147;
      fVar181 = local_980._8_4_;
      auVar30._8_4_ = fVar181 * fVar152;
      fVar184 = local_980._12_4_;
      auVar30._12_4_ = fVar184 * fVar153;
      fVar187 = local_980._16_4_;
      auVar30._16_4_ = fVar187 * fVar154;
      fVar190 = local_980._20_4_;
      auVar30._20_4_ = fVar190 * fVar155;
      fVar193 = local_980._24_4_;
      auVar30._24_4_ = fVar193 * fVar156;
      auVar30._28_4_ = fVar118 + fVar148;
      auVar35._4_4_ = fVar164 * fVar96;
      auVar35._0_4_ = fVar157 * fVar94;
      auVar35._8_4_ = fVar166 * fVar99;
      auVar35._12_4_ = fVar167 * fVar22;
      auVar35._16_4_ = fVar168 * fVar23;
      auVar35._20_4_ = fVar169 * fVar24;
      auVar35._24_4_ = fVar170 * fVar25;
      auVar35._28_4_ = uVar4;
      auVar29 = vsubps_avx(auVar35,auVar30);
      auVar36._4_4_ = fVar164 * fVar207;
      auVar36._0_4_ = fVar157 * fVar205;
      auVar36._8_4_ = fVar166 * fVar209;
      auVar36._12_4_ = fVar167 * fVar211;
      auVar36._16_4_ = fVar168 * fVar213;
      auVar36._20_4_ = fVar169 * fVar215;
      auVar36._24_4_ = fVar170 * fVar217;
      auVar36._28_4_ = fVar118 + fVar148;
      auVar37._4_4_ = fVar178 * fVar85;
      auVar37._0_4_ = fVar173 * fVar78;
      auVar37._8_4_ = fVar181 * fVar86;
      auVar37._12_4_ = fVar184 * fVar87;
      auVar37._16_4_ = fVar187 * fVar88;
      auVar37._20_4_ = fVar190 * fVar89;
      auVar37._24_4_ = fVar193 * fVar90;
      auVar37._28_4_ = auVar143._28_4_ + auVar32._28_4_;
      auVar30 = vsubps_avx(auVar37,auVar36);
      fVar78 = *(float *)(ray + k * 4 + 0x50);
      fVar85 = *(float *)(ray + k * 4 + 0x60);
      fStack_b10 = *(float *)(ray + k * 4 + 0x40);
      fVar158 = auVar28._0_4_ * fStack_b10 + fVar78 * auVar29._0_4_ + auVar30._0_4_ * fVar85;
      fVar165 = auVar28._4_4_ * fStack_b10 + fVar78 * auVar29._4_4_ + auVar30._4_4_ * fVar85;
      auVar159._0_8_ = CONCAT44(fVar165,fVar158);
      auVar159._8_4_ = auVar28._8_4_ * fStack_b10 + fVar78 * auVar29._8_4_ + auVar30._8_4_ * fVar85;
      auVar159._12_4_ =
           auVar28._12_4_ * fStack_b10 + fVar78 * auVar29._12_4_ + auVar30._12_4_ * fVar85;
      auVar160._16_4_ =
           auVar28._16_4_ * fStack_b10 + fVar78 * auVar29._16_4_ + auVar30._16_4_ * fVar85;
      auVar160._0_16_ = auVar159;
      auVar160._20_4_ =
           auVar28._20_4_ * fStack_b10 + fVar78 * auVar29._20_4_ + auVar30._20_4_ * fVar85;
      auVar162._24_4_ =
           auVar28._24_4_ * fStack_b10 + fVar78 * auVar29._24_4_ + auVar30._24_4_ * fVar85;
      auVar162._0_24_ = auVar160;
      auVar162._28_4_ = auVar28._28_4_ + auVar29._28_4_ + auVar30._28_4_;
      local_9e0 = vsubps_avx(auVar32,auVar137);
      local_a00 = vsubps_avx(auVar33,auVar26);
      fVar86 = auVar137._0_4_ + fVar2;
      fVar87 = auVar137._4_4_ + fVar11;
      fVar88 = auVar137._8_4_ + fVar97;
      fVar89 = auVar137._12_4_ + fVar101;
      fVar90 = auVar137._16_4_ + fVar13;
      fVar147 = auVar137._20_4_ + fVar16;
      fVar151 = auVar137._24_4_ + fVar19;
      fVar152 = fVar9 + auVar26._0_4_;
      fVar153 = fVar12 + auVar26._4_4_;
      fVar154 = fVar98 + auVar26._8_4_;
      fVar155 = fVar102 + auVar26._12_4_;
      fVar156 = fVar14 + auVar26._16_4_;
      fVar157 = fVar17 + auVar26._20_4_;
      fVar164 = fVar20 + auVar26._24_4_;
      fVar174 = local_a00._0_4_;
      fVar179 = local_a00._4_4_;
      auVar38._4_4_ = fVar179 * fVar87;
      auVar38._0_4_ = fVar174 * fVar86;
      fVar182 = local_a00._8_4_;
      auVar38._8_4_ = fVar182 * fVar88;
      fVar185 = local_a00._12_4_;
      auVar38._12_4_ = fVar185 * fVar89;
      fVar188 = local_a00._16_4_;
      auVar38._16_4_ = fVar188 * fVar90;
      fVar191 = local_a00._20_4_;
      auVar38._20_4_ = fVar191 * fVar147;
      fVar194 = local_a00._24_4_;
      auVar38._24_4_ = fVar194 * fVar151;
      auVar38._28_4_ = auVar29._28_4_;
      fVar206 = local_9e0._0_4_;
      fVar208 = local_9e0._4_4_;
      auVar39._4_4_ = fVar208 * fVar153;
      auVar39._0_4_ = fVar206 * fVar152;
      fVar210 = local_9e0._8_4_;
      auVar39._8_4_ = fVar210 * fVar154;
      fVar212 = local_9e0._12_4_;
      auVar39._12_4_ = fVar212 * fVar155;
      fVar214 = local_9e0._16_4_;
      auVar39._16_4_ = fVar214 * fVar156;
      fVar216 = local_9e0._20_4_;
      auVar39._20_4_ = fVar216 * fVar157;
      fVar218 = local_9e0._24_4_;
      auVar39._24_4_ = fVar218 * fVar164;
      auVar39._28_4_ = fVar148;
      auVar28 = vsubps_avx(auVar39,auVar38);
      auVar29 = vsubps_avx(auVar31,auVar142);
      fVar197 = auVar29._0_4_;
      fVar199 = auVar29._4_4_;
      auVar40._4_4_ = fVar199 * fVar153;
      auVar40._0_4_ = fVar197 * fVar152;
      fVar200 = auVar29._8_4_;
      auVar40._8_4_ = fVar200 * fVar154;
      fVar201 = auVar29._12_4_;
      auVar40._12_4_ = fVar201 * fVar155;
      fVar202 = auVar29._16_4_;
      auVar40._16_4_ = fVar202 * fVar156;
      fVar203 = auVar29._20_4_;
      auVar40._20_4_ = fVar203 * fVar157;
      fVar204 = auVar29._24_4_;
      auVar40._24_4_ = fVar204 * fVar164;
      auVar40._28_4_ = fVar148 + auVar26._28_4_;
      fVar148 = fVar10 + auVar142._0_4_;
      fVar152 = fVar95 + auVar142._4_4_;
      fVar153 = fVar100 + auVar142._8_4_;
      fVar154 = fVar103 + auVar142._12_4_;
      fVar155 = fVar15 + auVar142._16_4_;
      fVar156 = fVar18 + auVar142._20_4_;
      fVar157 = fVar21 + auVar142._24_4_;
      auVar41._4_4_ = fVar152 * fVar179;
      auVar41._0_4_ = fVar148 * fVar174;
      auVar41._8_4_ = fVar153 * fVar182;
      auVar41._12_4_ = fVar154 * fVar185;
      auVar41._16_4_ = fVar155 * fVar188;
      auVar41._20_4_ = fVar156 * fVar191;
      auVar41._24_4_ = fVar157 * fVar194;
      auVar41._28_4_ = local_a00._28_4_;
      auVar29 = vsubps_avx(auVar41,auVar40);
      auVar42._4_4_ = fVar152 * fVar208;
      auVar42._0_4_ = fVar148 * fVar206;
      auVar42._8_4_ = fVar153 * fVar210;
      auVar42._12_4_ = fVar154 * fVar212;
      auVar42._16_4_ = fVar155 * fVar214;
      auVar42._20_4_ = fVar156 * fVar216;
      auVar42._24_4_ = fVar157 * fVar218;
      auVar42._28_4_ = auVar31._28_4_ + auVar142._28_4_;
      auVar43._4_4_ = fVar199 * fVar87;
      auVar43._0_4_ = fVar197 * fVar86;
      auVar43._8_4_ = fVar200 * fVar88;
      auVar43._12_4_ = fVar201 * fVar89;
      auVar43._16_4_ = fVar202 * fVar90;
      auVar43._20_4_ = fVar203 * fVar147;
      auVar43._24_4_ = fVar204 * fVar151;
      auVar43._28_4_ = auVar137._28_4_ + auVar32._28_4_;
      auVar30 = vsubps_avx(auVar43,auVar42);
      local_a20._0_4_ = fStack_b10 * auVar28._0_4_ + auVar30._0_4_ * fVar85 + fVar78 * auVar29._0_4_
      ;
      local_a20._4_4_ = fStack_b10 * auVar28._4_4_ + auVar30._4_4_ * fVar85 + fVar78 * auVar29._4_4_
      ;
      local_a20._8_4_ = fStack_b10 * auVar28._8_4_ + auVar30._8_4_ * fVar85 + fVar78 * auVar29._8_4_
      ;
      local_a20._12_4_ =
           fStack_b10 * auVar28._12_4_ + auVar30._12_4_ * fVar85 + fVar78 * auVar29._12_4_;
      local_a20._16_4_ =
           fStack_b10 * auVar28._16_4_ + auVar30._16_4_ * fVar85 + fVar78 * auVar29._16_4_;
      local_a20._20_4_ =
           fStack_b10 * auVar28._20_4_ + auVar30._20_4_ * fVar85 + fVar78 * auVar29._20_4_;
      local_a20._24_4_ =
           fStack_b10 * auVar28._24_4_ + auVar30._24_4_ * fVar85 + fVar78 * auVar29._24_4_;
      local_a20._28_4_ = auVar29._28_4_ + auVar30._28_4_ + auVar29._28_4_;
      auVar28 = vsubps_avx(auVar142,auVar83);
      fVar164 = auVar142._0_4_ + auVar83._0_4_;
      fVar166 = auVar142._4_4_ + auVar83._4_4_;
      fVar167 = auVar142._8_4_ + auVar83._8_4_;
      fVar168 = auVar142._12_4_ + auVar83._12_4_;
      fVar169 = auVar142._16_4_ + auVar83._16_4_;
      fVar170 = auVar142._20_4_ + auVar83._20_4_;
      fVar111 = auVar142._24_4_ + auVar83._24_4_;
      auVar83 = vsubps_avx(auVar137,auVar143);
      fVar117 = auVar137._0_4_ + auVar143._0_4_;
      fVar128 = auVar137._4_4_ + auVar143._4_4_;
      fVar129 = auVar137._8_4_ + auVar143._8_4_;
      fVar130 = auVar137._12_4_ + auVar143._12_4_;
      fVar131 = auVar137._16_4_ + auVar143._16_4_;
      fVar132 = auVar137._20_4_ + auVar143._20_4_;
      fVar133 = auVar137._24_4_ + auVar143._24_4_;
      auVar29 = vsubps_avx(auVar26,auVar27);
      fVar153 = auVar26._0_4_ + auVar27._0_4_;
      fVar154 = auVar26._4_4_ + auVar27._4_4_;
      fVar155 = auVar26._8_4_ + auVar27._8_4_;
      fVar156 = auVar26._12_4_ + auVar27._12_4_;
      fVar157 = auVar26._16_4_ + auVar27._16_4_;
      fVar115 = auVar26._20_4_ + auVar27._20_4_;
      fVar116 = auVar26._24_4_ + auVar27._24_4_;
      fVar148 = auVar29._0_4_;
      fVar86 = auVar29._4_4_;
      auVar27._4_4_ = fVar128 * fVar86;
      auVar27._0_4_ = fVar117 * fVar148;
      fVar87 = auVar29._8_4_;
      auVar27._8_4_ = fVar129 * fVar87;
      fVar88 = auVar29._12_4_;
      auVar27._12_4_ = fVar130 * fVar88;
      fVar89 = auVar29._16_4_;
      auVar27._16_4_ = fVar131 * fVar89;
      fVar90 = auVar29._20_4_;
      auVar27._20_4_ = fVar132 * fVar90;
      fVar147 = auVar29._24_4_;
      auVar27._24_4_ = fVar133 * fVar147;
      auVar27._28_4_ = fVar118;
      fVar175 = auVar83._0_4_;
      fVar180 = auVar83._4_4_;
      auVar44._4_4_ = fVar180 * fVar154;
      auVar44._0_4_ = fVar175 * fVar153;
      fVar183 = auVar83._8_4_;
      auVar44._8_4_ = fVar183 * fVar155;
      fVar186 = auVar83._12_4_;
      auVar44._12_4_ = fVar186 * fVar156;
      fVar189 = auVar83._16_4_;
      auVar44._16_4_ = fVar189 * fVar157;
      fVar192 = auVar83._20_4_;
      auVar44._20_4_ = fVar192 * fVar115;
      fVar195 = auVar83._24_4_;
      auVar44._24_4_ = fVar195 * fVar116;
      auVar44._28_4_ = fVar141;
      auVar83 = vsubps_avx(auVar44,auVar27);
      fVar151 = auVar28._0_4_;
      fVar152 = auVar28._4_4_;
      auVar45._4_4_ = fVar152 * fVar154;
      auVar45._0_4_ = fVar151 * fVar153;
      fVar153 = auVar28._8_4_;
      auVar45._8_4_ = fVar153 * fVar155;
      fVar154 = auVar28._12_4_;
      auVar45._12_4_ = fVar154 * fVar156;
      fVar155 = auVar28._16_4_;
      auVar45._16_4_ = fVar155 * fVar157;
      fVar156 = auVar28._20_4_;
      auVar45._20_4_ = fVar156 * fVar115;
      fVar157 = auVar28._24_4_;
      auVar45._24_4_ = fVar157 * fVar116;
      auVar45._28_4_ = auVar26._28_4_ + fVar118;
      auVar26._4_4_ = fVar166 * fVar86;
      auVar26._0_4_ = fVar164 * fVar148;
      auVar26._8_4_ = fVar167 * fVar87;
      auVar26._12_4_ = fVar168 * fVar88;
      auVar26._16_4_ = fVar169 * fVar89;
      auVar26._20_4_ = fVar170 * fVar90;
      auVar26._24_4_ = fVar111 * fVar147;
      auVar26._28_4_ = fVar141;
      auVar26 = vsubps_avx(auVar26,auVar45);
      auVar46._4_4_ = fVar180 * fVar166;
      auVar46._0_4_ = fVar175 * fVar164;
      auVar46._8_4_ = fVar183 * fVar167;
      auVar46._12_4_ = fVar186 * fVar168;
      auVar46._16_4_ = fVar189 * fVar169;
      auVar46._20_4_ = fVar192 * fVar170;
      auVar46._24_4_ = fVar195 * fVar111;
      auVar46._28_4_ = auVar142._28_4_ + fVar141;
      auVar47._4_4_ = fVar152 * fVar128;
      auVar47._0_4_ = fVar151 * fVar117;
      auVar47._8_4_ = fVar153 * fVar129;
      auVar47._12_4_ = fVar154 * fVar130;
      auVar47._16_4_ = fVar155 * fVar131;
      auVar47._20_4_ = fVar156 * fVar132;
      auVar47._24_4_ = fVar157 * fVar133;
      auVar47._28_4_ = auVar137._28_4_ + auVar143._28_4_;
      auVar142 = vsubps_avx(auVar47,auVar46);
      auVar109._0_4_ = fStack_b10 * auVar83._0_4_ + auVar142._0_4_ * fVar85 + fVar78 * auVar26._0_4_
      ;
      auVar109._4_4_ = fStack_b10 * auVar83._4_4_ + auVar142._4_4_ * fVar85 + fVar78 * auVar26._4_4_
      ;
      auVar109._8_4_ = fStack_b10 * auVar83._8_4_ + auVar142._8_4_ * fVar85 + fVar78 * auVar26._8_4_
      ;
      auVar109._12_4_ =
           fStack_b10 * auVar83._12_4_ + auVar142._12_4_ * fVar85 + fVar78 * auVar26._12_4_;
      auVar109._16_4_ =
           fStack_b10 * auVar83._16_4_ + auVar142._16_4_ * fVar85 + fVar78 * auVar26._16_4_;
      auVar109._20_4_ =
           fStack_b10 * auVar83._20_4_ + auVar142._20_4_ * fVar85 + fVar78 * auVar26._20_4_;
      auVar109._24_4_ =
           fStack_b10 * auVar83._24_4_ + auVar142._24_4_ * fVar85 + fVar78 * auVar26._24_4_;
      auVar109._28_4_ = auVar26._28_4_ + auVar142._28_4_ + auVar26._28_4_;
      fVar118 = auVar109._0_4_ + fVar158 + local_a20._0_4_;
      fVar166 = auVar109._4_4_ + fVar165 + local_a20._4_4_;
      auVar119._0_8_ = CONCAT44(fVar166,fVar118);
      auVar119._8_4_ = auVar109._8_4_ + auVar159._8_4_ + local_a20._8_4_;
      auVar119._12_4_ = auVar109._12_4_ + auVar159._12_4_ + local_a20._12_4_;
      auVar120._16_4_ = auVar109._16_4_ + auVar160._16_4_ + local_a20._16_4_;
      auVar120._0_16_ = auVar119;
      auVar120._20_4_ = auVar109._20_4_ + auVar160._20_4_ + local_a20._20_4_;
      auVar122._24_4_ = auVar109._24_4_ + auVar162._24_4_ + local_a20._24_4_;
      auVar122._0_24_ = auVar120;
      auVar122._28_4_ = auVar109._28_4_ + auVar162._28_4_ + local_a20._28_4_;
      auVar142 = vminps_avx(auVar162,local_a20);
      auVar142 = vminps_avx(auVar142,auVar109);
      auVar145._8_4_ = 0x7fffffff;
      auVar145._0_8_ = 0x7fffffff7fffffff;
      auVar145._12_4_ = 0x7fffffff;
      auVar145._16_4_ = 0x7fffffff;
      auVar145._20_4_ = 0x7fffffff;
      auVar145._24_4_ = 0x7fffffff;
      auVar145._28_4_ = 0x7fffffff;
      local_a40 = vandps_avx(auVar145,auVar122);
      fVar164 = local_a40._0_4_ * 1.1920929e-07;
      fVar167 = local_a40._4_4_ * 1.1920929e-07;
      auVar48._4_4_ = fVar167;
      auVar48._0_4_ = fVar164;
      fVar168 = local_a40._8_4_ * 1.1920929e-07;
      auVar48._8_4_ = fVar168;
      fVar169 = local_a40._12_4_ * 1.1920929e-07;
      auVar48._12_4_ = fVar169;
      fVar170 = local_a40._16_4_ * 1.1920929e-07;
      auVar48._16_4_ = fVar170;
      fVar111 = local_a40._20_4_ * 1.1920929e-07;
      auVar48._20_4_ = fVar111;
      fVar115 = local_a40._24_4_ * 1.1920929e-07;
      auVar48._24_4_ = fVar115;
      auVar48._28_4_ = 0x34000000;
      auVar134._0_8_ = CONCAT44(fVar167,fVar164) ^ 0x8000000080000000;
      auVar134._8_4_ = -fVar168;
      auVar134._12_4_ = -fVar169;
      auVar134._16_4_ = -fVar170;
      auVar134._20_4_ = -fVar111;
      auVar134._24_4_ = -fVar115;
      auVar134._28_4_ = 0xb4000000;
      auVar142 = vcmpps_avx(auVar142,auVar134,5);
      auVar137 = vmaxps_avx(auVar162,local_a20);
      auVar83 = vmaxps_avx(auVar137,auVar109);
      auVar83 = vcmpps_avx(auVar83,auVar48,2);
      auVar83 = vorps_avx(auVar142,auVar83);
      if ((((((((auVar83 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar83 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar83 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar83 >> 0x7f,0) != '\0') ||
            (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar83 >> 0xbf,0) != '\0') ||
          (auVar83 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar83[0x1f] < '\0') {
        auVar49._4_4_ = fVar208 * fVar96;
        auVar49._0_4_ = fVar206 * fVar94;
        auVar49._8_4_ = fVar210 * fVar99;
        auVar49._12_4_ = fVar212 * fVar22;
        auVar49._16_4_ = fVar214 * fVar23;
        auVar49._20_4_ = fVar216 * fVar24;
        auVar49._24_4_ = fVar218 * fVar25;
        auVar49._28_4_ = auVar142._28_4_;
        auVar50._4_4_ = fVar207 * fVar179;
        auVar50._0_4_ = fVar205 * fVar174;
        auVar50._8_4_ = fVar209 * fVar182;
        auVar50._12_4_ = fVar211 * fVar185;
        auVar50._16_4_ = fVar213 * fVar188;
        auVar50._20_4_ = fVar215 * fVar191;
        auVar50._24_4_ = fVar217 * fVar194;
        auVar50._28_4_ = 0x34000000;
        auVar143 = vsubps_avx(auVar50,auVar49);
        auVar51._4_4_ = fVar180 * fVar179;
        auVar51._0_4_ = fVar175 * fVar174;
        auVar51._8_4_ = fVar183 * fVar182;
        auVar51._12_4_ = fVar186 * fVar185;
        auVar51._16_4_ = fVar189 * fVar188;
        auVar51._20_4_ = fVar192 * fVar191;
        auVar51._24_4_ = fVar195 * fVar194;
        auVar51._28_4_ = auVar137._28_4_;
        auVar52._4_4_ = fVar208 * fVar86;
        auVar52._0_4_ = fVar206 * fVar148;
        auVar52._8_4_ = fVar210 * fVar87;
        auVar52._12_4_ = fVar212 * fVar88;
        auVar52._16_4_ = fVar214 * fVar89;
        auVar52._20_4_ = fVar216 * fVar90;
        auVar52._24_4_ = fVar218 * fVar147;
        auVar52._28_4_ = fVar141;
        auVar26 = vsubps_avx(auVar52,auVar51);
        auVar142 = vandps_avx(auVar145,auVar49);
        auVar137 = vandps_avx(auVar145,auVar51);
        auVar142 = vcmpps_avx(auVar142,auVar137,1);
        local_860 = vblendvps_avx(auVar26,auVar143,auVar142);
        auVar53._4_4_ = fVar199 * fVar86;
        auVar53._0_4_ = fVar197 * fVar148;
        auVar53._8_4_ = fVar200 * fVar87;
        auVar53._12_4_ = fVar201 * fVar88;
        auVar53._16_4_ = fVar202 * fVar89;
        auVar53._20_4_ = fVar203 * fVar90;
        auVar53._24_4_ = fVar204 * fVar147;
        auVar53._28_4_ = auVar29._28_4_;
        auVar54._4_4_ = fVar199 * fVar96;
        auVar54._0_4_ = fVar197 * fVar94;
        auVar54._8_4_ = fVar200 * fVar99;
        auVar54._12_4_ = fVar201 * fVar22;
        auVar54._16_4_ = fVar202 * fVar23;
        auVar54._20_4_ = fVar203 * fVar24;
        auVar54._24_4_ = fVar204 * fVar25;
        auVar54._28_4_ = auVar143._28_4_;
        auVar55._4_4_ = fVar178 * fVar179;
        auVar55._0_4_ = fVar173 * fVar174;
        auVar55._8_4_ = fVar181 * fVar182;
        auVar55._12_4_ = fVar184 * fVar185;
        auVar55._16_4_ = fVar187 * fVar188;
        auVar55._20_4_ = fVar190 * fVar191;
        auVar55._24_4_ = fVar193 * fVar194;
        auVar55._28_4_ = auVar137._28_4_;
        auVar143 = vsubps_avx(auVar54,auVar55);
        auVar56._4_4_ = fVar179 * fVar152;
        auVar56._0_4_ = fVar174 * fVar151;
        auVar56._8_4_ = fVar182 * fVar153;
        auVar56._12_4_ = fVar185 * fVar154;
        auVar56._16_4_ = fVar188 * fVar155;
        auVar56._20_4_ = fVar191 * fVar156;
        auVar56._24_4_ = fVar194 * fVar157;
        auVar56._28_4_ = auVar26._28_4_;
        auVar26 = vsubps_avx(auVar56,auVar53);
        auVar142 = vandps_avx(auVar145,auVar55);
        auVar137 = vandps_avx(auVar145,auVar53);
        auVar137 = vcmpps_avx(auVar142,auVar137,1);
        local_840 = vblendvps_avx(auVar26,auVar143,auVar137);
        auVar57._4_4_ = fVar208 * fVar152;
        auVar57._0_4_ = fVar206 * fVar151;
        auVar57._8_4_ = fVar210 * fVar153;
        auVar57._12_4_ = fVar212 * fVar154;
        auVar57._16_4_ = fVar214 * fVar155;
        auVar57._20_4_ = fVar216 * fVar156;
        auVar57._24_4_ = fVar218 * fVar157;
        auVar57._28_4_ = auVar28._28_4_;
        auVar58._4_4_ = fVar178 * fVar208;
        auVar58._0_4_ = fVar173 * fVar206;
        auVar58._8_4_ = fVar181 * fVar210;
        auVar58._12_4_ = fVar184 * fVar212;
        auVar58._16_4_ = fVar187 * fVar214;
        auVar58._20_4_ = fVar190 * fVar216;
        auVar58._24_4_ = fVar193 * fVar218;
        auVar58._28_4_ = auVar137._28_4_;
        auVar59._4_4_ = fVar199 * fVar207;
        auVar59._0_4_ = fVar197 * fVar205;
        auVar59._8_4_ = fVar200 * fVar209;
        auVar59._12_4_ = fVar201 * fVar211;
        auVar59._16_4_ = fVar202 * fVar213;
        auVar59._20_4_ = fVar203 * fVar215;
        auVar59._24_4_ = fVar204 * fVar217;
        auVar59._28_4_ = auVar143._28_4_;
        auVar60._4_4_ = fVar199 * fVar180;
        auVar60._0_4_ = fVar197 * fVar175;
        auVar60._8_4_ = fVar200 * fVar183;
        auVar60._12_4_ = fVar201 * fVar186;
        auVar60._16_4_ = fVar202 * fVar189;
        auVar60._20_4_ = fVar203 * fVar192;
        auVar60._24_4_ = fVar204 * fVar195;
        auVar60._28_4_ = local_9c0._28_4_;
        auVar26 = vsubps_avx(auVar58,auVar59);
        auVar27 = vsubps_avx(auVar60,auVar57);
        auVar137 = vandps_avx(auVar145,auVar59);
        auVar143 = vandps_avx(auVar145,auVar57);
        auVar143 = vcmpps_avx(auVar137,auVar143,1);
        local_820 = vblendvps_avx(auVar27,auVar26,auVar143);
        auVar82 = vpackssdw_avx(auVar83._0_16_,auVar83._16_16_);
        fVar148 = fStack_b10 * local_860._0_4_ + local_820._0_4_ * fVar85 + local_840._0_4_ * fVar78
        ;
        fVar94 = fStack_b10 * local_860._4_4_ + local_820._4_4_ * fVar85 + local_840._4_4_ * fVar78;
        fVar96 = fStack_b10 * local_860._8_4_ + local_820._8_4_ * fVar85 + local_840._8_4_ * fVar78;
        fVar86 = fStack_b10 * local_860._12_4_ +
                 local_820._12_4_ * fVar85 + local_840._12_4_ * fVar78;
        fVar99 = fStack_b10 * local_860._16_4_ +
                 local_820._16_4_ * fVar85 + local_840._16_4_ * fVar78;
        fVar87 = fStack_b10 * local_860._20_4_ +
                 local_820._20_4_ * fVar85 + local_840._20_4_ * fVar78;
        fVar78 = fStack_b10 * local_860._24_4_ +
                 local_820._24_4_ * fVar85 + local_840._24_4_ * fVar78;
        fVar85 = auVar27._28_4_ + auVar27._28_4_ + 0.0;
        auVar106._0_4_ = fVar148 + fVar148;
        auVar106._4_4_ = fVar94 + fVar94;
        auVar106._8_4_ = fVar96 + fVar96;
        auVar106._12_4_ = fVar86 + fVar86;
        auVar106._16_4_ = fVar99 + fVar99;
        auVar106._20_4_ = fVar87 + fVar87;
        auVar106._24_4_ = fVar78 + fVar78;
        auVar106._28_4_ = fVar85 + fVar85;
        fVar148 = local_860._0_4_ * fVar10 + local_820._0_4_ * fVar9 + local_840._0_4_ * fVar2;
        fVar95 = local_860._4_4_ * fVar95 + local_820._4_4_ * fVar12 + local_840._4_4_ * fVar11;
        fVar97 = local_860._8_4_ * fVar100 + local_820._8_4_ * fVar98 + local_840._8_4_ * fVar97;
        fVar98 = local_860._12_4_ * fVar103 +
                 local_820._12_4_ * fVar102 + local_840._12_4_ * fVar101;
        fVar100 = local_860._16_4_ * fVar15 + local_820._16_4_ * fVar14 + local_840._16_4_ * fVar13;
        fVar101 = local_860._20_4_ * fVar18 + local_820._20_4_ * fVar17 + local_840._20_4_ * fVar16;
        fVar102 = local_860._24_4_ * fVar21 + local_820._24_4_ * fVar20 + local_840._24_4_ * fVar19;
        fVar103 = auVar137._28_4_ + fVar85 + auVar137._28_4_;
        auVar83 = vrcpps_avx(auVar106);
        fVar78 = auVar83._0_4_;
        fVar85 = auVar83._4_4_;
        auVar61._4_4_ = auVar106._4_4_ * fVar85;
        auVar61._0_4_ = auVar106._0_4_ * fVar78;
        fVar2 = auVar83._8_4_;
        auVar61._8_4_ = auVar106._8_4_ * fVar2;
        fVar9 = auVar83._12_4_;
        auVar61._12_4_ = auVar106._12_4_ * fVar9;
        fVar10 = auVar83._16_4_;
        auVar61._16_4_ = auVar106._16_4_ * fVar10;
        fVar11 = auVar83._20_4_;
        auVar61._20_4_ = auVar106._20_4_ * fVar11;
        fVar12 = auVar83._24_4_;
        auVar61._24_4_ = auVar106._24_4_ * fVar12;
        auVar61._28_4_ = auVar142._28_4_;
        auVar138._8_4_ = 0x3f800000;
        auVar138._0_8_ = 0x3f8000003f800000;
        auVar138._12_4_ = 0x3f800000;
        auVar138._16_4_ = 0x3f800000;
        auVar138._20_4_ = 0x3f800000;
        auVar138._24_4_ = 0x3f800000;
        auVar138._28_4_ = 0x3f800000;
        auVar142 = vsubps_avx(auVar138,auVar61);
        local_880._4_4_ = (fVar95 + fVar95) * (fVar85 + fVar85 * auVar142._4_4_);
        local_880._0_4_ = (fVar148 + fVar148) * (fVar78 + fVar78 * auVar142._0_4_);
        local_880._8_4_ = (fVar97 + fVar97) * (fVar2 + fVar2 * auVar142._8_4_);
        local_880._12_4_ = (fVar98 + fVar98) * (fVar9 + fVar9 * auVar142._12_4_);
        local_880._16_4_ = (fVar100 + fVar100) * (fVar10 + fVar10 * auVar142._16_4_);
        local_880._20_4_ = (fVar101 + fVar101) * (fVar11 + fVar11 * auVar142._20_4_);
        local_880._24_4_ = (fVar102 + fVar102) * (fVar12 + fVar12 * auVar142._24_4_);
        local_880._28_4_ = fVar103 + fVar103;
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
        auVar123._4_4_ = uVar1;
        auVar123._0_4_ = uVar1;
        auVar123._8_4_ = uVar1;
        auVar123._12_4_ = uVar1;
        auVar123._16_4_ = uVar1;
        auVar123._20_4_ = uVar1;
        auVar123._24_4_ = uVar1;
        auVar123._28_4_ = uVar1;
        auVar142 = vcmpps_avx(auVar123,local_880,2);
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar139._4_4_ = uVar1;
        auVar139._0_4_ = uVar1;
        auVar139._8_4_ = uVar1;
        auVar139._12_4_ = uVar1;
        auVar139._16_4_ = uVar1;
        auVar139._20_4_ = uVar1;
        auVar139._24_4_ = uVar1;
        auVar139._28_4_ = uVar1;
        auVar83 = vcmpps_avx(local_880,auVar139,2);
        auVar142 = vandps_avx(auVar83,auVar142);
        auVar113 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
        auVar82 = vpand_avx(auVar113,auVar82);
        auVar113 = vpmovsxwd_avx(auVar82);
        auVar91 = vpshufd_avx(auVar82,0xee);
        auVar91 = vpmovsxwd_avx(auVar91);
        auVar124._16_16_ = auVar91;
        auVar124._0_16_ = auVar113;
        if ((((((((auVar124 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar124 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar124 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar124 >> 0x7f,0) != '\0') ||
              (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar91 >> 0x3f,0) != '\0') ||
            (auVar124 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar91[0xf] < '\0') {
          auVar142 = vcmpps_avx(auVar106,_DAT_01faff00,4);
          auVar113 = vpackssdw_avx(auVar142._0_16_,auVar142._16_16_);
          auVar82 = vpand_avx(auVar82,auVar113);
          auVar113 = vpmovsxwd_avx(auVar82);
          auVar91 = vpunpckhwd_avx(auVar82,auVar82);
          local_8e0._16_16_ = auVar91;
          local_8e0._0_16_ = auVar113;
          if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (local_8e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (local_8e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(local_8e0 >> 0x7f,0) != '\0') ||
                (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar91 >> 0x3f,0) != '\0') ||
              (local_8e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar91[0xf] < '\0') {
            local_b00._8_8_ = auVar159._8_8_;
            local_b00._16_8_ = auVar160._16_8_;
            local_b00._24_8_ = auVar162._24_8_;
            uStack_958 = local_b00._8_8_;
            uStack_950 = local_b00._16_8_;
            uStack_948 = local_b00._24_8_;
            local_c60._8_8_ = auVar119._8_8_;
            local_c60._16_8_ = auVar120._16_8_;
            local_c60._24_8_ = auVar122._24_8_;
            uStack_918 = local_c60._8_8_;
            uStack_910 = local_c60._16_8_;
            uStack_908 = local_c60._24_8_;
            local_900 = &local_c78;
            pGVar72 = (context->scene->geometries).items[pGVar69->_geomID].ptr;
            if ((pGVar72->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar72->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_00349b3b:
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar77;
              }
              auVar113 = *(undefined1 (*) [16])(local_c78 + local_c70 * 4);
              auVar91 = auVar113;
              if (2 < local_c68) {
                auVar91 = *(undefined1 (*) [16])(local_c78 + local_c70 * 8);
              }
              auVar142 = vrcpps_avx(auVar122);
              fVar78 = auVar142._0_4_;
              fVar85 = auVar142._4_4_;
              auVar62._4_4_ = fVar166 * fVar85;
              auVar62._0_4_ = fVar118 * fVar78;
              fVar2 = auVar142._8_4_;
              auVar62._8_4_ = auVar119._8_4_ * fVar2;
              fVar9 = auVar142._12_4_;
              auVar62._12_4_ = auVar119._12_4_ * fVar9;
              fVar10 = auVar142._16_4_;
              auVar62._16_4_ = auVar120._16_4_ * fVar10;
              fVar11 = auVar142._20_4_;
              auVar62._20_4_ = auVar120._20_4_ * fVar11;
              fVar12 = auVar142._24_4_;
              auVar62._24_4_ = auVar122._24_4_ * fVar12;
              auVar62._28_4_ = auVar122._28_4_;
              auVar125._8_4_ = 0x3f800000;
              auVar125._0_8_ = 0x3f8000003f800000;
              auVar125._12_4_ = 0x3f800000;
              auVar125._16_4_ = 0x3f800000;
              auVar125._20_4_ = 0x3f800000;
              auVar125._24_4_ = 0x3f800000;
              auVar125._28_4_ = 0x3f800000;
              auVar83 = vsubps_avx(auVar125,auVar62);
              auVar84._0_4_ = fVar78 + fVar78 * auVar83._0_4_;
              auVar84._4_4_ = fVar85 + fVar85 * auVar83._4_4_;
              auVar84._8_4_ = fVar2 + fVar2 * auVar83._8_4_;
              auVar84._12_4_ = fVar9 + fVar9 * auVar83._12_4_;
              auVar84._16_4_ = fVar10 + fVar10 * auVar83._16_4_;
              auVar84._20_4_ = fVar11 + fVar11 * auVar83._20_4_;
              auVar84._24_4_ = fVar12 + fVar12 * auVar83._24_4_;
              auVar84._28_4_ = auVar142._28_4_ + auVar83._28_4_;
              auVar93._8_4_ = 0x219392ef;
              auVar93._0_8_ = 0x219392ef219392ef;
              auVar93._12_4_ = 0x219392ef;
              auVar93._16_4_ = 0x219392ef;
              auVar93._20_4_ = 0x219392ef;
              auVar93._24_4_ = 0x219392ef;
              auVar93._28_4_ = 0x219392ef;
              auVar142 = vcmpps_avx(local_a40,auVar93,5);
              auVar142 = vandps_avx(auVar142,auVar84);
              auVar63._4_4_ = auVar142._4_4_ * fVar165;
              auVar63._0_4_ = auVar142._0_4_ * fVar158;
              auVar63._8_4_ = auVar142._8_4_ * auVar159._8_4_;
              auVar63._12_4_ = auVar142._12_4_ * auVar159._12_4_;
              auVar63._16_4_ = auVar142._16_4_ * auVar160._16_4_;
              auVar63._20_4_ = auVar142._20_4_ * auVar160._20_4_;
              auVar63._24_4_ = auVar142._24_4_ * auVar162._24_4_;
              auVar63._28_4_ = auVar84._28_4_;
              local_c20 = vminps_avx(auVar63,auVar125);
              auVar64._4_4_ = local_a20._4_4_ * auVar142._4_4_;
              auVar64._0_4_ = local_a20._0_4_ * auVar142._0_4_;
              auVar64._8_4_ = local_a20._8_4_ * auVar142._8_4_;
              auVar64._12_4_ = local_a20._12_4_ * auVar142._12_4_;
              auVar64._16_4_ = local_a20._16_4_ * auVar142._16_4_;
              auVar64._20_4_ = local_a20._20_4_ * auVar142._20_4_;
              auVar64._24_4_ = local_a20._24_4_ * auVar142._24_4_;
              auVar64._28_4_ = auVar142._28_4_;
              auVar142 = vminps_avx(auVar64,auVar125);
              auVar136 = *(undefined1 (*) [16])local_c78;
              if (local_c70 == 2) {
                auVar136 = vpshufd_avx(auVar136,0x54);
                auVar113 = vpshufd_avx(auVar113,0x54);
                auVar91 = vpshufd_avx(auVar91,0x54);
              }
              auVar135._16_16_ = auVar113;
              auVar135._0_16_ = auVar136;
              auVar140._16_16_ = auVar91;
              auVar140._0_16_ = auVar113;
              auVar83 = vunpcklps_avx(auVar135,auVar140);
              auVar136 = vpshufd_avx(auVar136,0xa5);
              auVar104 = vpshufd_avx(auVar113,0xa5);
              auVar146._16_16_ = auVar104;
              auVar146._0_16_ = auVar136;
              auVar113 = vpshufd_avx(auVar113,0x94);
              auVar91 = vpshufd_avx(auVar91,0x94);
              local_c40._16_16_ = auVar91;
              local_c40._0_16_ = auVar113;
              auVar163._0_16_ = vpsrld_avx(auVar83._0_16_,0x10);
              auVar171 = vpsrld_avx(auVar83._16_16_,0x10);
              auVar150._8_4_ = 0xffff;
              auVar150._0_8_ = 0xffff0000ffff;
              auVar150._12_4_ = 0xffff;
              auVar150._16_4_ = 0xffff;
              auVar150._20_4_ = 0xffff;
              auVar150._24_4_ = 0xffff;
              auVar150._28_4_ = 0xffff;
              auVar83 = vandps_avx(auVar150,auVar83);
              auVar137 = vcvtdq2ps_avx(auVar83);
              auVar163._16_16_ = auVar171;
              auVar143 = vcvtdq2ps_avx(auVar163);
              auVar126._0_16_ = vpsrld_avx(auVar136,0x10);
              auVar136 = vpsrld_avx(auVar104,0x10);
              auVar83 = vandps_avx(auVar146,auVar150);
              auVar26 = vcvtdq2ps_avx(auVar83);
              auVar126._16_16_ = auVar136;
              auVar27 = vcvtdq2ps_avx(auVar126);
              auVar107._0_16_ = vpsrld_avx(auVar113,0x10);
              auVar113 = vpsrld_avx(auVar91,0x10);
              auVar83 = vandps_avx(auVar150,local_c40);
              auVar83 = vcvtdq2ps_avx(auVar83);
              auVar107._16_16_ = auVar113;
              auVar28 = vcvtdq2ps_avx(auVar107);
              auVar127._8_4_ = 0x3f800000;
              auVar127._0_8_ = 0x3f8000003f800000;
              auVar127._12_4_ = 0x3f800000;
              auVar127._16_4_ = 0x3f800000;
              auVar127._20_4_ = 0x3f800000;
              auVar127._24_4_ = 0x3f800000;
              auVar127._28_4_ = 0x3f800000;
              auVar29 = vsubps_avx(auVar127,local_c20);
              auVar29 = vsubps_avx(auVar29,auVar142);
              local_8c0._0_4_ =
                   auVar142._0_4_ * auVar83._0_4_ * 0.00012207031 +
                   auVar26._0_4_ * 0.00012207031 * local_c20._0_4_ +
                   auVar29._0_4_ * auVar137._0_4_ * 0.00012207031;
              local_8c0._4_4_ =
                   auVar142._4_4_ * auVar83._4_4_ * 0.00012207031 +
                   auVar26._4_4_ * 0.00012207031 * local_c20._4_4_ +
                   auVar29._4_4_ * auVar137._4_4_ * 0.00012207031;
              local_8c0._8_4_ =
                   auVar142._8_4_ * auVar83._8_4_ * 0.00012207031 +
                   auVar26._8_4_ * 0.00012207031 * local_c20._8_4_ +
                   auVar29._8_4_ * auVar137._8_4_ * 0.00012207031;
              local_8c0._12_4_ =
                   auVar142._12_4_ * auVar83._12_4_ * 0.00012207031 +
                   auVar26._12_4_ * 0.00012207031 * local_c20._12_4_ +
                   auVar29._12_4_ * auVar137._12_4_ * 0.00012207031;
              local_8c0._16_4_ =
                   auVar142._16_4_ * auVar83._16_4_ * 0.00012207031 +
                   auVar26._16_4_ * 0.00012207031 * local_c20._16_4_ +
                   auVar29._16_4_ * auVar137._16_4_ * 0.00012207031;
              local_8c0._20_4_ =
                   auVar142._20_4_ * auVar83._20_4_ * 0.00012207031 +
                   auVar26._20_4_ * 0.00012207031 * local_c20._20_4_ +
                   auVar29._20_4_ * auVar137._20_4_ * 0.00012207031;
              local_8c0._24_4_ =
                   auVar142._24_4_ * auVar83._24_4_ * 0.00012207031 +
                   auVar26._24_4_ * 0.00012207031 * local_c20._24_4_ +
                   auVar29._24_4_ * auVar137._24_4_ * 0.00012207031;
              local_8c0._28_4_ = auVar83._28_4_ + 0.0 + auVar142._28_4_;
              local_8a0[0] = auVar142._0_4_ * auVar28._0_4_ * 0.00012207031 +
                             local_c20._0_4_ * auVar27._0_4_ * 0.00012207031 +
                             auVar143._0_4_ * 0.00012207031 * auVar29._0_4_;
              local_8a0[1] = auVar142._4_4_ * auVar28._4_4_ * 0.00012207031 +
                             local_c20._4_4_ * auVar27._4_4_ * 0.00012207031 +
                             auVar143._4_4_ * 0.00012207031 * auVar29._4_4_;
              local_8a0[2] = auVar142._8_4_ * auVar28._8_4_ * 0.00012207031 +
                             local_c20._8_4_ * auVar27._8_4_ * 0.00012207031 +
                             auVar143._8_4_ * 0.00012207031 * auVar29._8_4_;
              local_8a0[3] = auVar142._12_4_ * auVar28._12_4_ * 0.00012207031 +
                             local_c20._12_4_ * auVar27._12_4_ * 0.00012207031 +
                             auVar143._12_4_ * 0.00012207031 * auVar29._12_4_;
              fStack_890 = auVar142._16_4_ * auVar28._16_4_ * 0.00012207031 +
                           local_c20._16_4_ * auVar27._16_4_ * 0.00012207031 +
                           auVar143._16_4_ * 0.00012207031 * auVar29._16_4_;
              fStack_88c = auVar142._20_4_ * auVar28._20_4_ * 0.00012207031 +
                           local_c20._20_4_ * auVar27._20_4_ * 0.00012207031 +
                           auVar143._20_4_ * 0.00012207031 * auVar29._20_4_;
              fStack_888 = auVar142._24_4_ * auVar28._24_4_ * 0.00012207031 +
                           local_c20._24_4_ * auVar27._24_4_ * 0.00012207031 +
                           auVar143._24_4_ * 0.00012207031 * auVar29._24_4_;
              fStack_884 = auVar28._28_4_ + auVar27._28_4_ + auVar29._28_4_;
              auVar82 = vpacksswb_avx(auVar82,auVar82);
              bVar34 = SUB161(auVar82 >> 7,0) & 1 | (SUB161(auVar82 >> 0xf,0) & 1) << 1 |
                       (SUB161(auVar82 >> 0x17,0) & 1) << 2 | (SUB161(auVar82 >> 0x1f,0) & 1) << 3 |
                       (SUB161(auVar82 >> 0x27,0) & 1) << 4 | (SUB161(auVar82 >> 0x2f,0) & 1) << 5 |
                       (SUB161(auVar82 >> 0x37,0) & 1) << 6 | SUB161(auVar82 >> 0x3f,0) << 7;
              uVar68 = (ulong)bVar34;
              lVar67 = 0;
              if (uVar68 != 0) {
                for (; (bVar34 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                }
              }
              auVar110 = ZEXT3264(auVar139);
              if (bVar34 != 0) {
                auVar82 = vpshufd_avx(ZEXT416(pGVar69->_geomID),0);
                local_b20 = auVar82._0_4_;
                uStack_b1c = auVar82._4_4_;
                uStack_b18 = auVar82._8_4_;
                uStack_b14 = auVar82._12_4_;
                local_b40 = vpshufd_avx(ZEXT416(pGVar69->_primID),0);
                auStack_b30 = auVar31._16_16_;
                auStack_b50 = auVar32._16_16_;
                local_b60 = *local_be0;
                auStack_b78 = auVar33._8_24_;
                local_b80 = pGVar72;
                local_c60 = auVar139;
                fStack_b0c = fStack_b10;
                fStack_b08 = fStack_b10;
                fStack_b04 = fStack_b10;
                local_b00 = auVar162;
                local_960 = auVar159._0_8_;
                local_940 = local_a20._0_4_;
                fStack_93c = local_a20._4_4_;
                fStack_938 = local_a20._8_4_;
                fStack_934 = local_a20._12_4_;
                fStack_930 = local_a20._16_4_;
                fStack_92c = local_a20._20_4_;
                fStack_928 = local_a20._24_4_;
                fStack_924 = local_a20._28_4_;
                local_920 = auVar119._0_8_;
                do {
                  local_aa0 = local_8a0[lVar67 + -8];
                  fVar78 = local_8a0[lVar67];
                  local_a90._4_4_ = fVar78;
                  local_a90._0_4_ = fVar78;
                  local_a90._8_4_ = fVar78;
                  local_a90._12_4_ = fVar78;
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_880 + lVar67 * 4);
                  local_bb0.context = context->user;
                  local_ad0 = *(undefined4 *)(local_860 + lVar67 * 4);
                  local_ac0 = *(undefined4 *)(local_840 + lVar67 * 4);
                  local_c20._0_8_ = lVar67;
                  local_ab0 = *(undefined4 *)(local_820 + lVar67 * 4);
                  local_a80 = local_b40._0_8_;
                  uStack_a78 = local_b40._8_8_;
                  local_a70._4_4_ = uStack_b1c;
                  local_a70._0_4_ = local_b20;
                  local_a70._8_4_ = uStack_b18;
                  local_a70._12_4_ = uStack_b14;
                  vcmpps_avx(ZEXT1632(local_a70),ZEXT1632(local_a70),0xf);
                  uStack_a5c = (local_bb0.context)->instID[0];
                  local_a60 = uStack_a5c;
                  uStack_a58 = uStack_a5c;
                  uStack_a54 = uStack_a5c;
                  uStack_a50 = (local_bb0.context)->instPrimID[0];
                  uStack_a4c = uStack_a50;
                  uStack_a48 = uStack_a50;
                  uStack_a44 = uStack_a50;
                  local_bf0 = local_b60;
                  local_bb0.valid = (int *)local_bf0;
                  local_bb0.geometryUserPtr = pGVar72->userPtr;
                  local_bb0.hit = (RTCHitN *)&local_ad0;
                  local_bb0.N = 4;
                  local_c40._0_8_ = uVar68;
                  local_bb0.ray = (RTCRayN *)ray;
                  uStack_acc = local_ad0;
                  uStack_ac8 = local_ad0;
                  uStack_ac4 = local_ad0;
                  uStack_abc = local_ac0;
                  uStack_ab8 = local_ac0;
                  uStack_ab4 = local_ac0;
                  uStack_aac = local_ab0;
                  uStack_aa8 = local_ab0;
                  uStack_aa4 = local_ab0;
                  fStack_a9c = local_aa0;
                  fStack_a98 = local_aa0;
                  fStack_a94 = local_aa0;
                  if (pGVar72->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar72->occlusionFilterN)(&local_bb0);
                    auVar110 = ZEXT3264(local_c60);
                    uVar68 = local_c40._0_8_;
                    pGVar72 = local_b80;
                  }
                  if (local_bf0 == (undefined1  [16])0x0) {
                    auVar119 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                    auVar119 = auVar119 ^ _DAT_01f7ae20;
                  }
                  else {
                    p_Var8 = context->args->filter;
                    if ((p_Var8 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar72->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var8)(&local_bb0);
                      auVar110 = ZEXT3264(local_c60);
                      uVar68 = local_c40._0_8_;
                      pGVar72 = local_b80;
                    }
                    auVar82 = vpcmpeqd_avx(local_bf0,_DAT_01f7aa10);
                    auVar119 = auVar82 ^ _DAT_01f7ae20;
                    auVar105._8_4_ = 0xff800000;
                    auVar105._0_8_ = 0xff800000ff800000;
                    auVar105._12_4_ = 0xff800000;
                    auVar82 = vblendvps_avx(auVar105,*(undefined1 (*) [16])(local_bb0.ray + 0x80),
                                            auVar82);
                    *(undefined1 (*) [16])(local_bb0.ray + 0x80) = auVar82;
                  }
                  auVar92._8_8_ = 0x100000001;
                  auVar92._0_8_ = 0x100000001;
                  if ((auVar92 & auVar119) != (undefined1  [16])0x0) goto LAB_00349b3b;
                  *(int *)(ray + k * 4 + 0x80) = auVar110._0_4_;
                  uVar68 = uVar68 ^ 1L << (local_c20._0_8_ & 0x3f);
                  lVar67 = 0;
                  if (uVar68 != 0) {
                    for (; (uVar68 >> lVar67 & 1) == 0; lVar67 = lVar67 + 1) {
                    }
                  }
                } while (uVar68 != 0);
              }
              auVar114 = ZEXT1664(local_bc0);
              auVar110 = ZEXT1664(local_bd0);
              goto LAB_00349aaf;
            }
          }
        }
      }
      auVar114 = ZEXT1664(local_bc0);
      auVar110 = ZEXT1664(local_bd0);
    }
    else {
      pGVar69 = (GridSOA *)(uVar68 & 0xfffffffffffffff0);
      uVar68 = *(ulong *)(pGVar69->data + pGVar69->rootOffset);
      (pre->super_Precalculations).grid = pGVar69;
      if (uVar68 != 0) {
        *puVar73 = uVar68;
        puVar73 = puVar73 + 1;
      }
    }
LAB_00349aaf:
    bVar77 = puVar73 != &local_800;
    if (!bVar77) {
      return bVar77;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }